

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void **ppvVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *p;
  Vec_Ptr_t *vBoxIns;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  uint uVar9;
  int iVar10;
  ushort uVar11;
  long lVar12;
  ulong local_50;
  
  p = Vec_PtrAlloc(pNtk->nObjCounts[8]);
  vBoxIns = Vec_PtrAlloc(pNtk->nObjCounts[8]);
  p_00 = Vec_PtrAlloc(100);
  for (iVar10 = 0; iVar10 < pNtk->vBoxes->nSize; iVar10 = iVar10 + 1) {
    pAVar5 = Abc_NtkBox(pNtk,iVar10);
    if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
      ppvVar2 = pAVar5->pNtk->vObjs->pArray;
      pAVar7 = (Abc_Obj_t *)ppvVar2[*(pAVar5->vFanouts).pArray];
      if (((*(uint *)&pAVar7->field_0x14 & 0xf) != 5) ||
         (pAVar8 = (Abc_Obj_t *)ppvVar2[*(pAVar5->vFanins).pArray],
         (*(uint *)&pAVar8->field_0x14 & 0xf) != 4)) {
        __assert_fail("Abc_ObjIsBo(pBo) && Abc_ObjIsBi(pBi)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                      ,0x338,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
      }
      Vec_PtrPush(vBoxIns,pAVar8);
      Abc_FlowRetime_CopyInitState(pAVar5,pAVar7);
      Vec_PtrPush(p,pAVar5);
      *(ushort *)(pManMR->pDataArray + (uint)pAVar7->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pAVar7->Id) | 8;
      Abc_ObjPatchFanin(pAVar7,pAVar5,pAVar8);
      Abc_ObjRemoveFanins(pAVar5);
      pcVar6 = Nm_ManFindNameById(pNtk->pManName,pAVar5->Id);
      if (pcVar6 != (char *)0x0) {
        Nm_ManDeleteIdName(pNtk->pManName,pAVar5->Id);
      }
    }
  }
  local_50 = 0;
  uVar9 = 0;
  iVar10 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar10) {
      fPathError = 0;
      if (pManMR->fVerbose != 0) {
        printf("\t\tVerifying latency along all paths...");
      }
      iVar10 = 0;
      do {
        if (pNtk->vObjs->nSize <= iVar10) {
          if (pManMR->fVerbose != 0) {
            puts(" ok");
          }
          for (iVar10 = 0; iVar10 < pNtk->vObjs->nSize; iVar10 = iVar10 + 1) {
            pAVar5 = Abc_NtkObj(pNtk,iVar10);
            if (pAVar5 != (Abc_Obj_t *)0x0) {
              pAVar5->field_0x14 = pAVar5->field_0x14 & 0x8f;
            }
          }
          while (p->nSize != 0) {
            pAVar5 = (Abc_Obj_t *)Vec_PtrPop(p);
            Abc_NtkDeleteObj(pAVar5);
          }
          Abc_FlowRetime_UpdateLags();
          Abc_FlowRetime_InitState(pNtk);
          Abc_FlowRetime_FixLatchBoxes(pNtk,vBoxIns);
          Vec_PtrFree(p);
          Vec_PtrFree(p_00);
          Vec_PtrFree(vBoxIns);
          if (pManMR->fVerbose != 0) {
            printf("\t\tmin-cut = %d (unmoved = %d)\n",(ulong)uVar9,local_50);
          }
          return uVar9;
        }
        pAVar5 = Abc_NtkObj(pNtk,iVar10);
        if (pAVar5 != (Abc_Obj_t *)0x0) {
          uVar3 = *(uint *)&pAVar5->field_0x14 & 0xf;
          if ((uVar3 == 5) || ((uVar3 == 2 && (pManMR->fIsForward == 0)))) {
            Abc_FlowRetime_VerifyPathLatencies_rec(pAVar5,0);
          }
          if (fPathError != 0) {
            if (0 < (pAVar5->vFanins).nSize) {
              printf("fanin ");
              print_node((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
            }
            putchar(10);
            exit(0);
          }
        }
        iVar10 = iVar10 + 1;
      } while( true );
    }
    pAVar5 = Abc_NtkObj(pNtk,iVar10);
    if (((pAVar5 != (Abc_Obj_t *)0x0) && (uVar3 = *(uint *)&pAVar5->field_0x14 & 0xf, uVar3 != 8))
       && (uVar1 = *(uint *)(pManMR->pDataArray + (uint)pAVar5->Id), (uVar1 >> 8 & 1) == 0)) {
      uVar11 = (ushort)uVar1 & 3;
      if (uVar11 == 1 && pManMR->fIsForward != 0) {
        __assert_fail("!pManMR->fIsForward || !FTEST(pObj, VISITED_E) || FTEST(pObj, VISITED_R)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                      ,0x351,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
      }
      if (uVar11 == 2) {
        if ((uVar1 & 4) == 0) {
          __assert_fail("FTEST(pObj, FLOW)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                        ,0x353,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
        }
        if (pManMR->fIsForward == 0) {
          if (uVar3 == 4) goto LAB_0040a8b8;
        }
        else if (uVar3 == 5) {
LAB_0040a8b8:
          local_50 = (ulong)((int)local_50 + 1);
        }
        uVar9 = uVar9 + 1;
        for (lVar12 = 0; lVar12 < (pAVar5->vFanouts).nSize; lVar12 = lVar12 + 1) {
          pAVar7 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanouts).pArray[lVar12]];
          iVar4 = Abc_FlowRetime_IsAcrossCut(pAVar5,pAVar7);
          if (iVar4 != 0) {
            Vec_PtrPush(p_00,pAVar7);
          }
        }
        if (p_00->nSize == 0) {
          print_node(pAVar5);
LAB_0040ab97:
          __assert_fail("Vec_PtrSize(vMove) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                        ,0x364,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
        }
        if (p_00->nSize < 1) goto LAB_0040ab97;
        if (p->nSize == 0) {
          __assert_fail("Vec_PtrSize( vFreeRegs )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                        ,0x367,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
        }
        pAVar7 = (Abc_Obj_t *)Vec_PtrPop(p);
        Abc_ObjAddFanin(pAVar7,pAVar5);
        iVar4 = 1;
        while (iVar4 != 0) {
          pAVar8 = (Abc_Obj_t *)Vec_PtrPop(p_00);
          Abc_ObjPatchFanin(pAVar8,pAVar5,pAVar7);
          if (((*(uint *)&pAVar8->field_0x14 & 0xf) == 4) && ((pAVar8->vFanins).nSize != 1)) {
            __assert_fail("Abc_ObjFaninNum(pNext) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                          ,0x36e,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
          }
          iVar4 = p_00->nSize;
        }
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

int
Abc_FlowRetime_ImplementCut( Abc_Ntk_t * pNtk ) {
  int i, j, cut = 0, unmoved = 0;
  Abc_Obj_t *pObj, *pReg, *pNext, *pBo = NULL, *pBi = NULL;
  Vec_Ptr_t *vFreeRegs = Vec_PtrAlloc( Abc_NtkLatchNum(pNtk) );
  Vec_Ptr_t *vBoxIns = Vec_PtrAlloc( Abc_NtkLatchNum(pNtk) );
  Vec_Ptr_t *vMove = Vec_PtrAlloc( 100 );

  // remove latches from netlist
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    pBo = Abc_ObjFanout0(pObj);
    pBi = Abc_ObjFanin0(pObj);
    assert(Abc_ObjIsBo(pBo) && Abc_ObjIsBi(pBi));
    Vec_PtrPush( vBoxIns, pBi );

    // copy initial state values to BO
    Abc_FlowRetime_CopyInitState( pObj, pBo );

    // re-use latch elsewhere
    Vec_PtrPush( vFreeRegs, pObj );
    FSET(pBo, CROSS_BOUNDARY);

    // cut out of netlist
    Abc_ObjPatchFanin( pBo, pObj, pBi );
    Abc_ObjRemoveFanins( pObj );

    // free name
    if (Nm_ManFindNameById(pNtk->pManName, Abc_ObjId(pObj)))
      Nm_ManDeleteIdName( pNtk->pManName, Abc_ObjId(pObj));
  }

  // insert latches into netlist
  Abc_NtkForEachObj( pNtk, pObj, i ) {
    if (Abc_ObjIsLatch( pObj )) continue;
    if (FTEST(pObj, BIAS_NODE)) continue;
    
    // a latch is required on every node that lies across the min-cit
    assert(!pManMR->fIsForward || !FTEST(pObj, VISITED_E) || FTEST(pObj, VISITED_R));
    if (FTEST(pObj, VISITED_R) && !FTEST(pObj, VISITED_E)) {
      assert(FTEST(pObj, FLOW));

      // count size of cut
      cut++;
      if ((pManMR->fIsForward && Abc_ObjIsBo(pObj)) || 
          (!pManMR->fIsForward && Abc_ObjIsBi(pObj)))
        unmoved++;
      
      // only insert latch between fanouts that lie across min-cut
      // some fanout paths may be cut at deeper points
      Abc_ObjForEachFanout( pObj, pNext, j )
        if (Abc_FlowRetime_IsAcrossCut( pObj, pNext ))
          Vec_PtrPush(vMove, pNext);

      // check that move-set is non-zero
      if (Vec_PtrSize(vMove) == 0)
        print_node(pObj);
      assert(Vec_PtrSize(vMove) > 0);
      
      // insert one of re-useable registers
      assert(Vec_PtrSize( vFreeRegs ));
      pReg = (Abc_Obj_t *)Vec_PtrPop( vFreeRegs );
      
      Abc_ObjAddFanin(pReg, pObj);
      while(Vec_PtrSize( vMove )) {
        pNext = (Abc_Obj_t *)Vec_PtrPop( vMove );
        Abc_ObjPatchFanin( pNext, pObj, pReg );
        if (Abc_ObjIsBi(pNext)) assert(Abc_ObjFaninNum(pNext) == 1);

      }
      // APH: broken by bias nodes  if (Abc_ObjIsBi(pObj)) assert(Abc_ObjFaninNum(pObj) == 1);
    }
  }

#if defined(DEBUG_CHECK)        
  Abc_FlowRetime_VerifyPathLatencies( pNtk );
#endif

  // delete remaining latches
  while(Vec_PtrSize( vFreeRegs )) {
    pReg = (Abc_Obj_t *)Vec_PtrPop( vFreeRegs );
    Abc_NtkDeleteObj( pReg );
  }
  
  // update initial states
  Abc_FlowRetime_UpdateLags( );
  Abc_FlowRetime_InitState( pNtk );

  // restore latch boxes
  Abc_FlowRetime_FixLatchBoxes( pNtk, vBoxIns );

  Vec_PtrFree( vFreeRegs );
  Vec_PtrFree( vMove );
  Vec_PtrFree( vBoxIns );

  vprintf("\t\tmin-cut = %d (unmoved = %d)\n", cut, unmoved);
  return cut;
}